

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::Attribute::get_value<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Attribute *this)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  oStack_38;
  
  primvar::PrimVar::get_value<std::__cxx11::string>(&oStack_38,&this->_var);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,&oStack_38);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&oStack_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }